

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::SumColumns::dim_forward(SumColumns *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  int bd;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffd0);
  if (sVar2 != 1) {
    sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
    uVar5 = CONCAT13(sVar2 == 2,(int3)uVar5);
  }
  if ((char)((uint)uVar5 >> 0x18) == '\0') {
    __assert_fail("xs.size() == 1 || xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x9f,"virtual Dim cnn::SumColumns::dim_forward(const vector<Dim> &) const");
  }
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 == 1) {
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  }
  else {
    pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
    std::max<unsigned_int>(&pvVar4->bd,&pvVar3->bd);
  }
  pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::rows(pvVar4);
  x._M_len = 1;
  x._M_array = (iterator)&stack0xffffffffffffffd4;
  Dim::Dim((Dim *)CONCAT44(uVar1,uVar5),x,(uint)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

Dim SumColumns::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1 || xs.size() == 2);
  int bd = (xs.size() == 1 ? xs[0].bd : max(xs[0].bd, xs[1].bd));
  return Dim({xs[0].rows()}, bd);
}